

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckPurifyOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  int *piVar1;
  pointer pbVar2;
  pointer pbVar3;
  cmCTest *this_00;
  pointer pbVar4;
  bool bVar5;
  __type _Var6;
  int iVar7;
  ulong uVar8;
  ostream *poVar9;
  ulong uVar10;
  long lVar11;
  pointer s;
  ulong uVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string local_410;
  RegularExpression pfW;
  ostringstream ostr;
  ostringstream cmCTestLog_msg;
  
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmsys::SystemTools::Split(str,&lines);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
  log->_M_string_length = 0;
  *(log->_M_dataplus)._M_p = '\0';
  cmsys::RegularExpression::RegularExpression(&pfW,"^\\[[WEI]\\] ([A-Z][A-Z][A-Z][A-Z]*): ");
  pbVar4 = lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar7 = 0;
  s = lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (s == pbVar4) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)log,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      this->DefectCount = this->DefectCount + iVar7;
      cmsys::RegularExpression::~RegularExpression(&pfW);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&lines);
      return iVar7 == 0;
    }
    pbVar2 = (this->ResultStrings).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = (this->ResultStrings).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar5 = cmsys::RegularExpression::find(&pfW,s);
    uVar10 = (long)pbVar2 - (long)pbVar3 >> 5;
    if (bVar5) {
      lVar11 = 0;
      for (uVar12 = 0;
          uVar8 = (long)(this->ResultStrings).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->ResultStrings).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5, uVar12 < uVar8;
          uVar12 = uVar12 + 1) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&cmCTestLog_msg,&pfW.regmatch,1);
        _Var6 = std::operator==((string *)&cmCTestLog_msg,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(((this->ResultStrings).
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar11));
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        if (_Var6) {
          uVar8 = (long)(this->ResultStrings).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->ResultStrings).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5;
          uVar10 = uVar12;
          break;
        }
        lVar11 = lVar11 + 0x20;
      }
      if (uVar8 == uVar12) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar9 = std::operator<<((ostream *)&cmCTestLog_msg,"Unknown Purify memory fault: ");
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_410,&pfW.regmatch,1);
        poVar9 = std::operator<<(poVar9,(string *)&local_410);
        std::endl<char,std::char_traits<char>>(poVar9);
        std::__cxx11::string::~string((string *)&local_410);
        this_00 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x38a,local_410._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&local_410);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar9 = std::operator<<((ostream *)&ostr,"*** Unknown Purify memory fault: ");
        cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)&cmCTestLog_msg,&pfW.regmatch,1);
        poVar9 = std::operator<<(poVar9,(string *)&cmCTestLog_msg);
        std::endl<char,std::char_traits<char>>(poVar9);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      }
    }
    if (uVar10 != (long)(this->ResultStrings).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->ResultStrings).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) {
      poVar9 = std::operator<<((ostream *)&ostr,"<b>");
      poVar9 = std::operator<<(poVar9,(string *)
                                      ((this->ResultStrings).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar10));
      std::operator<<(poVar9,"</b> ");
      piVar1 = (results->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start + uVar10;
      *piVar1 = *piVar1 + 1;
      iVar7 = iVar7 + 1;
    }
    poVar9 = std::operator<<((ostream *)&ostr,(string *)s);
    std::endl<char,std::char_traits<char>>(poVar9);
    s = s + 1;
  } while( true );
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckPurifyOutput(
  const std::string& str, std::string& log, std::vector<int>& results)
{
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);
  std::ostringstream ostr;
  log.clear();

  cmsys::RegularExpression pfW("^\\[[WEI]\\] ([A-Z][A-Z][A-Z][A-Z]*): ");

  int defects = 0;

  for (std::string const& l : lines) {
    std::vector<int>::size_type failure = this->ResultStrings.size();
    if (pfW.find(l)) {
      std::vector<int>::size_type cc;
      for (cc = 0; cc < this->ResultStrings.size(); cc++) {
        if (pfW.match(1) == this->ResultStrings[cc]) {
          failure = cc;
          break;
        }
      }
      if (cc == this->ResultStrings.size()) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Unknown Purify memory fault: " << pfW.match(1)
                                                   << std::endl);
        ostr << "*** Unknown Purify memory fault: " << pfW.match(1)
             << std::endl;
      }
    }
    if (failure != this->ResultStrings.size()) {
      ostr << "<b>" << this->ResultStrings[failure] << "</b> ";
      results[failure]++;
      defects++;
    }
    ostr << l << std::endl;
  }

  log = ostr.str();
  this->DefectCount += defects;
  return defects == 0;
}